

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.h
# Opt level: O2

SpotLight *
embree::SceneGraph::SpotLight::lerp
          (SpotLight *__return_storage_ptr__,SpotLight *light0,SpotLight *light1,float f)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  
  fVar29 = 1.0 - f;
  fVar5 = (light1->P).field_0.m128[0];
  fVar6 = (light1->P).field_0.m128[1];
  fVar7 = (light1->P).field_0.m128[2];
  fVar8 = (light1->P).field_0.m128[3];
  fVar9 = (light0->P).field_0.m128[0];
  fVar10 = (light0->P).field_0.m128[1];
  fVar11 = (light0->P).field_0.m128[2];
  fVar12 = (light0->P).field_0.m128[3];
  fVar13 = (light1->D).field_0.m128[0];
  fVar14 = (light1->D).field_0.m128[1];
  fVar15 = (light1->D).field_0.m128[2];
  fVar16 = (light1->D).field_0.m128[3];
  fVar17 = (light0->D).field_0.m128[0];
  fVar18 = (light0->D).field_0.m128[1];
  fVar19 = (light0->D).field_0.m128[2];
  fVar20 = (light0->D).field_0.m128[3];
  fVar21 = (light1->I).field_0.m128[0];
  fVar22 = (light1->I).field_0.m128[1];
  fVar23 = (light1->I).field_0.m128[2];
  fVar24 = (light1->I).field_0.m128[3];
  fVar25 = (light0->I).field_0.m128[0];
  fVar26 = (light0->I).field_0.m128[1];
  fVar27 = (light0->I).field_0.m128[2];
  fVar28 = (light0->I).field_0.m128[3];
  (__return_storage_ptr__->super_Light).type = LIGHT_SPOT;
  (__return_storage_ptr__->P).field_0.m128[0] = fVar9 * fVar29 + fVar5 * f;
  (__return_storage_ptr__->P).field_0.m128[1] = fVar10 * fVar29 + fVar6 * f;
  (__return_storage_ptr__->P).field_0.m128[2] = fVar11 * fVar29 + fVar7 * f;
  (__return_storage_ptr__->P).field_0.m128[3] = fVar12 * fVar29 + fVar8 * f;
  (__return_storage_ptr__->D).field_0.m128[0] = fVar17 * fVar29 + fVar13 * f;
  (__return_storage_ptr__->D).field_0.m128[1] = fVar18 * fVar29 + fVar14 * f;
  (__return_storage_ptr__->D).field_0.m128[2] = fVar19 * fVar29 + fVar15 * f;
  (__return_storage_ptr__->D).field_0.m128[3] = fVar20 * fVar29 + fVar16 * f;
  (__return_storage_ptr__->I).field_0.m128[0] = fVar25 * fVar29 + fVar21 * f;
  (__return_storage_ptr__->I).field_0.m128[1] = fVar26 * fVar29 + fVar22 * f;
  (__return_storage_ptr__->I).field_0.m128[2] = fVar27 * fVar29 + fVar23 * f;
  (__return_storage_ptr__->I).field_0.m128[3] = fVar28 * fVar29 + fVar24 * f;
  uVar1 = light0->angleMin;
  uVar3 = light0->angleMax;
  uVar2 = light1->angleMin;
  uVar4 = light1->angleMax;
  __return_storage_ptr__->angleMin = (float)uVar1 * fVar29 + (float)uVar2 * f;
  __return_storage_ptr__->angleMax = (float)uVar3 * fVar29 + (float)uVar4 * f;
  return __return_storage_ptr__;
}

Assistant:

static SpotLight lerp(const SpotLight& light0, const SpotLight& light1, const float f)
      {
        return SpotLight(embree::lerp(light0.P,light1.P,f),
                         embree::lerp(light0.D,light1.D,f),
                         embree::lerp(light0.I,light1.I,f),
                         embree::lerp(light0.angleMin,light1.angleMin,f),
                         embree::lerp(light0.angleMax,light1.angleMax,f));
      }